

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O1

void __thiscall zmq::fq_t::activated(fq_t *this,pipe_t *pipe_)

{
  int iVar1;
  pointer pppVar2;
  size_type sVar3;
  pipe_t *ppVar4;
  pipe_t *ppVar5;
  pipe_t *__tmp;
  
  iVar1 = (pipe_->super_array_item_t<1>)._array_index;
  pppVar2 = (this->_pipes)._items.super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  sVar3 = this->_active;
  ppVar4 = pppVar2[iVar1];
  if (ppVar4 != (pipe_t *)0x0) {
    *(int *)((long)&ppVar4->super_array_item_t<1> + 8) = (int)sVar3;
  }
  ppVar5 = pppVar2[sVar3];
  if (ppVar5 != (pipe_t *)0x0) {
    *(int *)((long)&ppVar5->super_array_item_t<1> + 8) = iVar1;
  }
  pppVar2[iVar1] = ppVar5;
  pppVar2[sVar3] = ppVar4;
  this->_active = sVar3 + 1;
  return;
}

Assistant:

int get_array_index () const { return _array_index; }